

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

bool __thiscall duckdb::UpdateSegment::HasUncommittedUpdates(UpdateSegment *this,idx_t vector_index)

{
  pointer *__ptr;
  StorageLockKey *pSVar1;
  bool bVar2;
  UndoBufferPointer entry;
  UndoBufferReference pin;
  undefined1 local_58 [8];
  UndoBufferPointer local_50;
  UndoBufferReference local_40;
  
  pSVar1 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)local_58);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)local_58);
  local_50 = GetUpdateNode(this,pSVar1,vector_index);
  if (local_50.entry == (UndoBufferEntry *)0x0) {
    bVar2 = false;
  }
  else {
    UndoBufferPointer::Pin(&local_40,&local_50);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_40.handle.node);
    bVar2 = *(long *)((local_40.handle.node.ptr)->buffer + local_40.position + 0x38) != 0;
    BufferHandle::~BufferHandle(&local_40.handle);
  }
  if ((_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)local_58 !=
      (_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_58);
    operator_delete((void *)local_58);
  }
  return bVar2;
}

Assistant:

bool UpdateSegment::HasUncommittedUpdates(idx_t vector_index) {
	auto read_lock = lock.GetSharedLock();
	auto entry = GetUpdateNode(*read_lock, vector_index);
	if (!entry.IsSet()) {
		return false;
	}
	auto pin = entry.Pin();
	auto &info = UpdateInfo::Get(pin);
	if (info.HasNext()) {
		return true;
	}
	return false;
}